

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void selectWindowRewriteEList
               (Parse *pParse,Window *pWin,SrcList *pSrc,ExprList *pEList,Table *pTab,
               ExprList **ppSub)

{
  Walker *in_RCX;
  ExprList *in_R8;
  undefined8 *in_R9;
  long in_FS_OFFSET;
  WindowRewrite sRewrite;
  Walker sWalker;
  undefined1 local_68 [16];
  undefined8 local_58;
  undefined8 local_48;
  code *pcStack_30;
  code *local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = 0;
  uStack_20 = 0;
  local_48 = 0;
  local_58 = *in_R9;
  pcStack_30 = selectWindowRewriteExprCb;
  local_28 = selectWindowRewriteSelectCb;
  puStack_10 = local_68;
  sqlite3WalkExprList(in_RCX,in_R8);
  *in_R9 = local_58;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void selectWindowRewriteEList(
  Parse *pParse,
  Window *pWin,
  SrcList *pSrc,
  ExprList *pEList,               /* Rewrite expressions in this list */
  Table *pTab,
  ExprList **ppSub                /* IN/OUT: Sub-select expression-list */
){
  Walker sWalker;
  WindowRewrite sRewrite;

  assert( pWin!=0 );
  memset(&sWalker, 0, sizeof(Walker));
  memset(&sRewrite, 0, sizeof(WindowRewrite));

  sRewrite.pSub = *ppSub;
  sRewrite.pWin = pWin;
  sRewrite.pSrc = pSrc;
  sRewrite.pTab = pTab;

  sWalker.pParse = pParse;
  sWalker.xExprCallback = selectWindowRewriteExprCb;
  sWalker.xSelectCallback = selectWindowRewriteSelectCb;
  sWalker.u.pRewrite = &sRewrite;

  (void)sqlite3WalkExprList(&sWalker, pEList);

  *ppSub = sRewrite.pSub;
}